

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  long lVar2;
  size_t __n;
  int iVar3;
  AlphaNum *in_R8;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  string name_suffix;
  string_view existing_type;
  string_view this_type;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  ulong local_120;
  char *local_118;
  ulong local_110;
  char *local_108;
  string local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  ulong *local_80;
  code *local_78;
  ulong local_70;
  code *local_68;
  long local_60;
  code *local_58;
  ulong *local_50;
  code *local_48;
  ulong local_40;
  code *local_38;
  undefined1 **local_30;
  code *local_28;
  
  lVar1 = *(long *)this;
  local_118 = "default";
  local_108 = "default";
  if ((ulong)*(byte *)(lVar1 + 0x28) != 0) {
    local_108 = "custom";
  }
  local_110 = (ulong)*(byte *)(lVar1 + 0x28) ^ 7;
  lVar2 = *(long *)(this + 8);
  if ((ulong)*(byte *)(lVar2 + 0x28) != 0) {
    local_118 = "custom";
  }
  local_120 = (ulong)*(byte *)(lVar2 + 0x28) ^ 7;
  local_138 = 0;
  local_130 = 0;
  __n = *(size_t *)(lVar1 + 0x10);
  local_140 = &local_130;
  if (__n == *(size_t *)(lVar2 + 0x10)) {
    if (__n == 0) goto LAB_00232356;
    iVar3 = bcmp(*(void **)(lVar1 + 8),*(void **)(lVar2 + 8),__n);
    if (iVar3 == 0) goto LAB_00232356;
  }
  local_80 = (ulong *)0x3;
  local_78 = (code *)0x429190;
  local_b0.piece_._M_str = *(char **)(lVar2 + 8);
  local_b0.piece_._M_len = *(size_t *)(lVar2 + 0x10);
  local_e0.piece_._M_len = 2;
  local_e0.piece_._M_str = "\")";
  StrCat_abi_cxx11_(&local_100,(lts_20250127 *)&local_80,&local_b0,&local_e0,in_R8);
  std::__cxx11::string::operator=((string *)&local_140,(string *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
LAB_00232356:
  local_70 = *(ulong *)(*(long *)(this + 0x10) + 0x18) & 0xfffffffffffffffc;
  local_40 = *(ulong *)(**(long **)(this + 8) + 0x18) & 0xfffffffffffffffc;
  local_60 = *(long *)this + 8;
  local_80 = &local_110;
  local_78 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_68 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_58 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_50 = &local_120;
  local_48 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_38 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_30 = &local_140;
  local_28 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  format.size_ = (size_t)&local_80;
  format.data_ = (void *)0x56;
  args.len_ = in_R9;
  args.ptr_ = (pointer)&DAT_00000006;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)
             "The %s JSON name of field \"%s\" (\"%s\") conflicts with the %s JSON name of field \"%s\"%s."
             ,format,args);
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}